

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpActionRequest.c
# Opt level: O1

int UpnpActionRequest_assign(UpnpActionRequest *p,UpnpActionRequest *q)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  sockaddr_storage *psVar11;
  sockaddr_storage *psVar12;
  byte bVar13;
  
  bVar13 = 0;
  if (p == q) {
    uVar10 = 1;
  }
  else {
    p->m_ErrCode = q->m_ErrCode;
    p->m_Socket = q->m_Socket;
    pcVar8 = UpnpString_get_String(q->m_ErrStr);
    iVar7 = UpnpString_set_String(p->m_ErrStr,pcVar8);
    uVar10 = 0;
    if (iVar7 != 0) {
      pcVar8 = UpnpString_get_String(q->m_ActionName);
      iVar7 = UpnpString_set_String(p->m_ActionName,pcVar8);
      if (iVar7 != 0) {
        pcVar8 = UpnpString_get_String(q->m_DevUDN);
        iVar7 = UpnpString_set_String(p->m_DevUDN,pcVar8);
        if (iVar7 != 0) {
          pcVar8 = UpnpString_get_String(q->m_ServiceID);
          iVar7 = UpnpString_set_String(p->m_ServiceID,pcVar8);
          uVar10 = 0;
          if (iVar7 != 0) {
            p->m_ActionRequest = q->m_ActionRequest;
            p->m_ActionResult = q->m_ActionResult;
            p->m_SoapHeader = q->m_SoapHeader;
            psVar11 = &q->m_CtrlPtIPAddr;
            psVar12 = &p->m_CtrlPtIPAddr;
            for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
              cVar1 = psVar11->__ss_padding[0];
              cVar2 = psVar11->__ss_padding[1];
              cVar3 = psVar11->__ss_padding[2];
              cVar4 = psVar11->__ss_padding[3];
              cVar5 = psVar11->__ss_padding[4];
              cVar6 = psVar11->__ss_padding[5];
              psVar12->ss_family = psVar11->ss_family;
              psVar12->__ss_padding[0] = cVar1;
              psVar12->__ss_padding[1] = cVar2;
              psVar12->__ss_padding[2] = cVar3;
              psVar12->__ss_padding[3] = cVar4;
              psVar12->__ss_padding[4] = cVar5;
              psVar12->__ss_padding[5] = cVar6;
              psVar11 = (sockaddr_storage *)((long)psVar11 + (ulong)bVar13 * -0x10 + 8);
              psVar12 = (sockaddr_storage *)((long)psVar12 + (ulong)bVar13 * -0x10 + 8);
            }
            pcVar8 = UpnpString_get_String(q->m_Os);
            iVar7 = UpnpString_set_String(p->m_Os,pcVar8);
            uVar10 = (uint)(iVar7 != 0);
          }
        }
      }
    }
  }
  return uVar10;
}

Assistant:

int UpnpActionRequest_assign(UpnpActionRequest *p, const UpnpActionRequest *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpActionRequest_set_ErrCode(
				   p, UpnpActionRequest_get_ErrCode(q));
		ok = ok && UpnpActionRequest_set_Socket(
				   p, UpnpActionRequest_get_Socket(q));
		ok = ok && UpnpActionRequest_set_ErrStr(
				   p, UpnpActionRequest_get_ErrStr(q));
		ok = ok && UpnpActionRequest_set_ActionName(
				   p, UpnpActionRequest_get_ActionName(q));
		ok = ok && UpnpActionRequest_set_DevUDN(
				   p, UpnpActionRequest_get_DevUDN(q));
		ok = ok && UpnpActionRequest_set_ServiceID(
				   p, UpnpActionRequest_get_ServiceID(q));
		ok = ok && UpnpActionRequest_set_ActionRequest(
				   p, UpnpActionRequest_get_ActionRequest(q));
		ok = ok && UpnpActionRequest_set_ActionResult(
				   p, UpnpActionRequest_get_ActionResult(q));
		ok = ok && UpnpActionRequest_set_SoapHeader(
				   p, UpnpActionRequest_get_SoapHeader(q));
		ok = ok && UpnpActionRequest_set_CtrlPtIPAddr(
				   p, UpnpActionRequest_get_CtrlPtIPAddr(q));
		ok = ok &&
		     UpnpActionRequest_set_Os(p, UpnpActionRequest_get_Os(q));
	}

	return ok;
}